

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iltcdf.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  string *input_stream;
  int iVar8;
  char *__s_00;
  long lVar9;
  int interpolation_period;
  int frame_period;
  int num_filter_order;
  Buffer buffer;
  double signal;
  AllZeroLatticeDigitalFilter filter;
  vector<double,_std::allocator<double>_> filter_coefficients;
  ostringstream error_message_7;
  ifstream ifs2;
  InputSourcePreprocessingForFilterGain preprocessing;
  ifstream ifs1;
  InputSourceInterpolation interpolation;
  InputSourceFromStream input_source;
  int local_6f8;
  int local_6f4;
  int local_6f0;
  FilterGainType local_6ec;
  string local_6e8;
  string local_6c8;
  double local_6a8;
  AllZeroLatticeDigitalFilter local_6a0;
  vector<double,_std::allocator<double>_> local_690;
  string local_678 [3];
  ios_base local_608 [264];
  string local_500;
  byte abStack_4e0 [80];
  ios_base local_490 [408];
  InputSourcePreprocessingForFilterGain local_2f8;
  string local_2d8;
  byte abStack_2b8 [80];
  ios_base local_268 [408];
  InputSourceInterpolation local_d0;
  InputSourceFromStream local_50;
  
  local_6f0 = 0x19;
  local_6f4 = 100;
  local_6f8 = 1;
  iVar8 = 0;
  local_6ec = (FilterGainType)CONCAT71((int7)((ulong)&local_6f8 >> 8),1);
  do {
    iVar5 = ya_getopt_long(argc,argv,"m:p:i:kh",(option *)0x0,(int *)0x0);
    switch(iVar5) {
    case 0x68:
      anon_unknown.dwarf_2c15::PrintUsage((ostream *)&std::cout);
      iVar8 = 0;
      iVar7 = 1;
      break;
    case 0x69:
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)&local_500);
      bVar3 = sptk::ConvertStringToInteger(&local_2d8,&local_6f8);
      bVar2 = local_6f8 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"The argument for the -i option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"non-negative integer",0x14);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"iltcdf","");
        sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2d8);
LAB_00103a89:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
        std::ios_base::~ios_base(local_268);
        goto LAB_00103ab7;
      }
      goto LAB_00103a0b;
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
switchD_001037f1_caseD_6a:
      anon_unknown.dwarf_2c15::PrintUsage((ostream *)&std::cerr);
LAB_00103ab7:
      iVar7 = 1;
      iVar8 = 1;
      break;
    case 0x6b:
      iVar7 = 0;
      local_6ec = kLinear;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)&local_500);
      bVar3 = sptk::ConvertStringToInteger(&local_2d8,&local_6f0);
      bVar2 = local_6f0 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"non-negative integer",0x14);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"iltcdf","");
        sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2d8);
        goto LAB_00103a89;
      }
      goto LAB_00103a0b;
    case 0x70:
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)&local_500);
      bVar2 = sptk::ConvertStringToInteger(&local_2d8,&local_6f4);
      bVar3 = local_6f4 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"The argument for the -p option must be a positive integer"
                   ,0x39);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"iltcdf","");
        sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2d8);
        goto LAB_00103a89;
      }
LAB_00103a0b:
      iVar7 = 0;
      break;
    default:
      iVar7 = 2;
      if (iVar5 != -1) goto switchD_001037f1_caseD_6a;
    }
  } while (iVar7 == 0);
  if (iVar7 != 2) {
    return iVar8;
  }
  if (local_6f4 / 2 < local_6f8) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2d8,"Interpolation period must be equal to or less than half ",0x38
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8,"frame period",0xc);
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"iltcdf","");
    sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p == &local_500.field_2) goto LAB_00103b73;
  }
  else {
    paVar1 = &local_500.field_2;
    if (argc - ya_optind == 1) {
      lVar9 = (long)argc + -1;
      __s_00 = (char *)0x0;
LAB_00103bef:
      __s = argv[lVar9];
      bVar3 = sptk::SetBinaryMode();
      if (bVar3) {
        std::ifstream::ifstream(&local_2d8);
        std::ifstream::open((char *)&local_2d8,(_Ios_Openmode)__s);
        if ((abStack_2b8[*(long *)(local_2d8._M_dataplus._M_p + -0x18)] & 5) == 0) {
          input_stream = &local_500;
          std::ifstream::ifstream(input_stream);
          if ((__s_00 == (char *)0x0) ||
             (std::ifstream::open((char *)&local_500,(_Ios_Openmode)__s_00),
             (abStack_4e0[*(long *)(local_500._M_dataplus._M_p + -0x18)] & 5) == 0)) {
            cVar4 = std::__basic_file<char>::is_open();
            if (cVar4 == '\0') {
              input_stream = (string *)&std::cin;
            }
            lVar9 = (long)local_6f0;
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_690,lVar9 + 1U,(allocator_type *)local_678);
            sptk::InputSourceFromStream::InputSourceFromStream
                      (&local_50,false,(int)(lVar9 + 1U),(istream *)&local_2d8);
            sptk::InputSourceInterpolation::InputSourceInterpolation
                      (&local_d0,local_6f4,local_6f8,true,&local_50.super_InputSourceInterface);
            sptk::InputSourcePreprocessingForFilterGain::InputSourcePreprocessingForFilterGain
                      (&local_2f8,local_6ec & kLog ^ kUnity,&local_d0.super_InputSourceInterface);
            if (local_2f8.is_valid_ == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_678,"Failed to initialize InputSource",0x20);
              local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"iltcdf","");
              sptk::PrintErrorMessage(&local_6c8,(ostringstream *)local_678);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
                operator_delete(local_6c8._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
              std::ios_base::~ios_base(local_608);
              iVar8 = 1;
            }
            else {
              sptk::AllZeroLatticeDigitalFilter::AllZeroLatticeDigitalFilter(&local_6a0,local_6f0);
              local_6c8._M_dataplus._M_p = (pointer)&PTR__Buffer_00110b98;
              local_6c8._M_string_length = 0;
              local_6c8.field_2._M_allocated_capacity = 0;
              local_6c8.field_2._8_8_ = 0;
              if (local_6a0.is_valid_ == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_678,"Failed to initialize AllZeroLatticeDigitalFilter",
                           0x30);
                local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"iltcdf","");
                sptk::PrintErrorMessage(&local_6e8,(ostringstream *)local_678);
              }
              else {
                do {
                  bVar3 = sptk::ReadStream<double>(&local_6a8,(istream *)input_stream);
                  if (!bVar3) {
                    iVar8 = 0;
                    goto LAB_00104274;
                  }
                  bVar3 = sptk::InputSourcePreprocessingForFilterGain::Get
                                    (&local_2f8,
                                     (vector<double,_std::allocator<double>_> *)&local_690);
                  if (!bVar3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_678,"Cannot get filter coefficients",0x1e);
                    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_6e8,"iltcdf","");
                    sptk::PrintErrorMessage(&local_6e8,(ostringstream *)local_678);
                    goto LAB_0010423e;
                  }
                  bVar3 = sptk::AllZeroLatticeDigitalFilter::Run
                                    (&local_6a0,&local_690,&local_6a8,(Buffer *)&local_6c8);
                  if (!bVar3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_678,
                               "Failed to apply all-zero lattice digital filter",0x2f);
                    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_6e8,"iltcdf","");
                    sptk::PrintErrorMessage(&local_6e8,(ostringstream *)local_678);
                    goto LAB_0010423e;
                  }
                  bVar3 = sptk::WriteStream<double>(local_6a8,(ostream *)&std::cout);
                } while (bVar3);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_678,"Failed to write a filter output",0x1f);
                local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"iltcdf","");
                sptk::PrintErrorMessage(&local_6e8,(ostringstream *)local_678);
              }
LAB_0010423e:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
                operator_delete(local_6e8._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
              std::ios_base::~ios_base(local_608);
              iVar8 = 1;
LAB_00104274:
              local_6c8._M_dataplus._M_p = (pointer)&PTR__Buffer_00110b98;
              if ((void *)local_6c8._M_string_length != (void *)0x0) {
                operator_delete((void *)local_6c8._M_string_length);
              }
            }
            sptk::InputSourceInterpolation::~InputSourceInterpolation(&local_d0);
            if (local_690.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_690.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_678,"Cannot open file ",0x11);
            sVar6 = strlen(__s_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,__s_00,sVar6);
            local_d0.super_InputSourceInterface._vptr_InputSourceInterface =
                 (_func_int **)&local_d0.first_interpolation_period_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"iltcdf","");
            sptk::PrintErrorMessage((string *)&local_d0,(ostringstream *)local_678);
            if (local_d0.super_InputSourceInterface._vptr_InputSourceInterface !=
                (_func_int **)&local_d0.first_interpolation_period_) {
              operator_delete(local_d0.super_InputSourceInterface._vptr_InputSourceInterface);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
            std::ios_base::~ios_base(local_608);
            iVar8 = 1;
          }
          std::ifstream::~ifstream(&local_500);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_500);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_500,"Cannot open file ",0x11);
          if (__s == (char *)0x0) {
            std::ios::clear((int)&local_6f8 +
                            (int)*(undefined8 *)(local_500._M_dataplus._M_p + -0x18) + 0x1f8);
          }
          else {
            sVar6 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_500,__s,sVar6);
          }
          local_678[0]._M_dataplus._M_p = (pointer)&local_678[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"iltcdf","");
          sptk::PrintErrorMessage(local_678,(ostringstream *)&local_500);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678[0]._M_dataplus._M_p != &local_678[0].field_2) {
            operator_delete(local_678[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_500);
          std::ios_base::~ios_base(local_490);
          iVar8 = 1;
        }
        std::ifstream::~ifstream(&local_2d8);
        return iVar8;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2d8,"Cannot set translation mode",0x1b);
      local_500._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"iltcdf","");
      sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2d8);
    }
    else {
      if (argc - ya_optind == 2) {
        lVar9 = (long)argc + -2;
        __s_00 = argv[(long)argc + -1];
        goto LAB_00103bef;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2d8,"Just two input files, kfile and infile, are required",0x34);
      local_500._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"iltcdf","");
      sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p == paVar1) goto LAB_00103b73;
  }
  operator_delete(local_500._M_dataplus._M_p);
LAB_00103b73:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
  std::ios_base::~ios_base(local_268);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  bool gain_flag(kDefaultGainFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:p:i:kh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("iltcdf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("iltcdf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("iltcdf", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        gain_flag = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("iltcdf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, kfile and infile, are required";
    sptk::PrintErrorMessage("iltcdf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("iltcdf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("iltcdf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("iltcdf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &input_source);
  const sptk::InputSourcePreprocessingForFilterGain::FilterGainType gain_type(
      gain_flag ? sptk::InputSourcePreprocessingForFilterGain::FilterGainType::
                      kInverse
                : sptk::InputSourcePreprocessingForFilterGain::FilterGainType::
                      kUnity);
  sptk::InputSourcePreprocessingForFilterGain preprocessing(gain_type,
                                                            &interpolation);
  if (!preprocessing.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("iltcdf", error_message);
    return 1;
  }

  sptk::AllZeroLatticeDigitalFilter filter(num_filter_order);
  sptk::AllZeroLatticeDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize AllZeroLatticeDigitalFilter";
    sptk::PrintErrorMessage("iltcdf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!preprocessing.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("iltcdf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply all-zero lattice digital filter";
      sptk::PrintErrorMessage("iltcdf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("iltcdf", error_message);
      return 1;
    }
  }

  return 0;
}